

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdnslookup_p.cpp
# Opt level: O0

void QDnsLookupRunnable::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QDnsLookupRunnable *_t;
  QDnsLookupReply *in_stack_ffffffffffffffc8;
  QDnsLookupRunnable *in_stack_ffffffffffffffd0;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    finished(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QDnsLookupRunnable::*)(QDnsLookupReply_const&)>
              (in_RCX,(void **)finished,0,0);
  }
  return;
}

Assistant:

void QDnsLookupRunnable::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDnsLookupRunnable *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<QDnsLookupReply>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDnsLookupRunnable::*)(const QDnsLookupReply & )>(_a, &QDnsLookupRunnable::finished, 0))
            return;
    }
}